

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

Value * __thiscall
cmFileAPI::BuildClientReply(Value *__return_storage_ptr__,cmFileAPI *this,ClientQuery *q)

{
  bool bVar1;
  Value *pVVar2;
  Value *pVVar3;
  Value VStack_c8;
  Value local_a0;
  Value local_78;
  Value local_50;
  
  BuildReply(__return_storage_ptr__,this,&q->DirQuery);
  if (q->HaveQueryJson == true) {
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"query.json");
    if ((q->QueryJson).Error._M_string_length == 0) {
      pVVar3 = &(q->QueryJson).ClientValue;
      bVar1 = Json::Value::isNull(pVVar3);
      if (!bVar1) {
        Json::Value::Value(&local_a0,pVVar3);
        pVVar3 = Json::Value::operator[](pVVar2,"client");
        Json::Value::operator=(pVVar3,&local_a0);
        Json::Value::~Value(&local_a0);
      }
      pVVar3 = &(q->QueryJson).RequestsValue;
      bVar1 = Json::Value::isNull(pVVar3);
      if (!bVar1) {
        Json::Value::Value(&VStack_c8,pVVar3);
        pVVar3 = Json::Value::operator[](pVVar2,"requests");
        Json::Value::operator=(pVVar3,&VStack_c8);
        Json::Value::~Value(&VStack_c8);
      }
      pVVar3 = &local_78;
      BuildClientReplyResponses(pVVar3,this,&(q->QueryJson).Requests);
      pVVar2 = Json::Value::operator[](pVVar2,"responses");
      Json::Value::operator=(pVVar2,pVVar3);
    }
    else {
      pVVar3 = &local_50;
      BuildReplyError(pVVar3,&(q->QueryJson).Error);
      Json::Value::operator=(pVVar2,pVVar3);
    }
    Json::Value::~Value(pVVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildClientReply(ClientQuery const& q)
{
  Json::Value reply = this->BuildReply(q.DirQuery);

  if (!q.HaveQueryJson) {
    return reply;
  }

  Json::Value& reply_query_json = reply["query.json"];
  ClientQueryJson const& qj = q.QueryJson;

  if (!qj.Error.empty()) {
    reply_query_json = this->BuildReplyError(qj.Error);
    return reply;
  }

  if (!qj.ClientValue.isNull()) {
    reply_query_json["client"] = qj.ClientValue;
  }

  if (!qj.RequestsValue.isNull()) {
    reply_query_json["requests"] = qj.RequestsValue;
  }

  reply_query_json["responses"] = this->BuildClientReplyResponses(qj.Requests);

  return reply;
}